

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall
crnlib::crn_comp::optimize_alpha_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  bool bVar1;
  bool bVar2;
  vector<unsigned_short> *this_00;
  uint uVar3;
  uint uVar4;
  unsigned_short *puVar5;
  level_details *plVar6;
  endpoint_indices_details *peVar7;
  uint *puVar8;
  uint8 *puVar9;
  uint local_1dc;
  uint local_1ac;
  undefined1 local_160 [8];
  symbol_codec codec;
  uint16 s;
  uint8 *code_sizes;
  static_huffman_data_model dm;
  int sym_1;
  uint index_1;
  int sym;
  uint index;
  uint bEnd;
  uint b;
  uint alpha1_index;
  uint alpha0_index;
  uint local_50;
  uint level;
  bool hasAlpha1;
  bool hasAlpha0;
  vector<unsigned_int> hist;
  uint total_bits;
  uint16 n;
  vector<unsigned_short> *remapping;
  optimize_alpha_params *pParams;
  void *pData_ptr_local;
  uint64 data_local;
  crn_comp *this_local;
  
  this_00 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  hist.m_capacity._2_2_ = *(ushort *)((long)pData_ptr + 0x10);
  vector<unsigned_short>::resize(this_00,(uint)(ushort)hist.m_capacity._2_2_,false);
  if (data == 0) {
    sort_alpha_endpoints(this_00,*pData_ptr,hist.m_capacity._2_2_);
    optimize_alpha_selectors(this);
  }
  else {
    puVar5 = vector<unsigned_short>::get_ptr(this_00);
    remap_alpha_endpoints
              (puVar5,*pData_ptr,*(uint **)((long)pData_ptr + 8),hist.m_capacity._2_2_,
               *(uint16 *)((long)pData_ptr + 0x12),*(float *)((long)pData_ptr + 0x14));
  }
  pack_alpha_endpoints
            (this,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),this_00);
  uVar3 = vector<unsigned_char>::size
                    ((vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10));
  hist.m_size = uVar3 << 3;
  vector<unsigned_int>::vector((vector<unsigned_int> *)&level,(uint)(ushort)hist.m_capacity._2_2_);
  bVar1 = this->m_has_comp[1];
  bVar2 = this->m_has_comp[2];
  for (local_50 = 0; uVar3 = vector<crnlib::crn_comp::level_details>::size(&this->m_levels),
      local_50 < uVar3; local_50 = local_50 + 1) {
    b = 0;
    bEnd = 0;
    plVar6 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_50);
    index = plVar6->first_block;
    plVar6 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,local_50);
    uVar4 = index + plVar6->num_blocks;
    for (; index < uVar4; index = index + 1) {
      uVar3 = b;
      if ((bVar1 & 1U) != 0) {
        peVar7 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                           (&this->m_endpoint_indices,index);
        puVar5 = vector<unsigned_short>::operator[](this_00,(uint)(peVar7->field_0).field_0.alpha0);
        uVar3 = (uint)*puVar5;
        peVar7 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                           (&this->m_endpoint_indices,index);
        if (peVar7->reference == '\0') {
          local_1ac = uVar3 - b;
          if ((int)local_1ac < 0) {
            local_1ac = local_1ac + (ushort)hist.m_capacity._2_2_;
          }
          puVar8 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&level,local_1ac);
          *puVar8 = *puVar8 + 1;
        }
      }
      b = uVar3;
      uVar3 = bEnd;
      if ((bVar2 & 1U) != 0) {
        peVar7 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                           (&this->m_endpoint_indices,index);
        puVar5 = vector<unsigned_short>::operator[](this_00,(uint)(peVar7->field_0).field_0.alpha1);
        uVar3 = (uint)*puVar5;
        peVar7 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                           (&this->m_endpoint_indices,index);
        if (peVar7->reference == '\0') {
          dm._52_4_ = uVar3 - bEnd;
          local_1dc = dm._52_4_;
          if ((int)dm._52_4_ < 0) {
            local_1dc = dm._52_4_ + (uint)(ushort)hist.m_capacity._2_2_;
          }
          puVar8 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&level,local_1dc);
          *puVar8 = *puVar8 + 1;
        }
      }
      bEnd = uVar3;
    }
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&code_sizes);
  vector<unsigned_int>::get_ptr((vector<unsigned_int> *)&level);
  static_huffman_data_model::init((static_huffman_data_model *)&code_sizes,(EVP_PKEY_CTX *)0x1);
  puVar9 = static_huffman_data_model::get_code_sizes((static_huffman_data_model *)&code_sizes);
  for (codec.m_mode._2_2_ = cNull >> 0x10;
      (ushort)codec.m_mode._2_2_ < (ushort)hist.m_capacity._2_2_;
      codec.m_mode._2_2_ = codec.m_mode._2_2_ + 1) {
    puVar8 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)&level,(uint)(ushort)codec.m_mode._2_2_);
    hist.m_size = *puVar8 * (uint)puVar9[(ushort)codec.m_mode._2_2_] + hist.m_size;
  }
  symbol_codec::symbol_codec((symbol_codec *)local_160);
  symbol_codec::start_encoding((symbol_codec *)local_160,0x10000);
  symbol_codec::encode_enable_simulation((symbol_codec *)local_160,true);
  symbol_codec::encode_transmit_static_huffman_data_model
            ((symbol_codec *)local_160,(static_huffman_data_model *)&code_sizes,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding((symbol_codec *)local_160,false);
  uVar3 = symbol_codec::encode_get_total_bits_written((symbol_codec *)local_160);
  hist.m_size = hist.m_size + uVar3;
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = hist.m_size;
  crnlib_delete<crnlib::optimize_alpha_params>((optimize_alpha_params *)pData_ptr);
  symbol_codec::~symbol_codec((symbol_codec *)local_160);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&code_sizes);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)&level);
  return;
}

Assistant:

void crn_comp::optimize_alpha_endpoints_task(uint64 data, void* pData_ptr)
    {
        optimize_alpha_params* pParams = reinterpret_cast<optimize_alpha_params*>(pData_ptr);
        crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
        uint16 n = pParams->n;
        remapping.resize(n);

        if (data)
        {
            remap_alpha_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
        }
        else
        {
            sort_alpha_endpoints(remapping, pParams->unpacked_endpoints, n);
            optimize_alpha_selectors();
        }

        pack_alpha_endpoints(pParams->pResult->packed_endpoints, remapping);
        uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

        crnlib::vector<uint> hist(n);
        bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
        for (uint level = 0; level < m_levels.size(); level++)
        {
            for (uint alpha0_index = 0, alpha1_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++)
            {
                if (hasAlpha0)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha0]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha0_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha0_index = index;
                }
                if (hasAlpha1)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha1]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha1_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha1_index = index;
                }
            }
        }

        static_huffman_data_model dm;
        dm.init(true, n, hist.get_ptr(), 16);
        const uint8* code_sizes = dm.get_code_sizes();
        for (uint16 s = 0; s < n; s++)
        {
            total_bits += hist[s] * code_sizes[s];
        }

        symbol_codec codec;
        codec.start_encoding(64 * 1024);
        codec.encode_enable_simulation(true);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        codec.stop_encoding(false);
        total_bits += codec.encode_get_total_bits_written();

        pParams->pResult->total_bits = total_bits;

        crnlib_delete(pParams);
    }